

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_key(ImGuiInputTextState *str,STB_TexteditState *state,int key)

{
  bool bVar1;
  ImWchar IVar2;
  int iVar3;
  uint in_EDX;
  STB_TexteditState *in_RSI;
  ImGuiInputTextState *in_RDI;
  float fVar4;
  int n_2;
  int n_1;
  int n;
  float dx_1;
  float x_1;
  float goal_x_1;
  int sel_1;
  int i_1;
  StbTexteditRow row_1;
  StbFindState find_1;
  float dx;
  int start;
  float x;
  float goal_x;
  int sel;
  int i;
  StbTexteditRow row;
  StbFindState find;
  ImWchar ch;
  int c;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff39;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  float fVar5;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  StbFindState *in_stack_ffffffffffffff70;
  int local_80;
  float local_7c;
  int local_70;
  int local_68;
  float local_5c;
  int local_50;
  float local_4c;
  int local_38;
  float local_34;
  int local_28;
  int local_24;
  uint local_14;
  
  local_14 = in_EDX;
  do {
    while( true ) {
      if (local_14 == 0x10000) {
        if (in_RSI->select_start == in_RSI->select_end) {
          if (0 < in_RSI->cursor) {
            in_RSI->cursor = in_RSI->cursor + -1;
          }
        }
        else {
          stb_textedit_move_to_first((STB_TexteditState *)0x189c2e);
        }
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10001) {
        if (in_RSI->select_start == in_RSI->select_end) {
          in_RSI->cursor = in_RSI->cursor + 1;
        }
        else {
          stb_textedit_move_to_last
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
        }
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 != 0x10002) break;
LAB_0018a17b:
      in_stack_ffffffffffffff64 = (uint)((local_14 & 0x20000) != 0);
      if (in_RSI->single_line == '\0') {
        if (in_stack_ffffffffffffff64 == 0) {
          if (in_RSI->select_start != in_RSI->select_end) {
            stb_textedit_move_to_first((STB_TexteditState *)0x18a1fc);
          }
        }
        else {
          stb_textedit_prep_selection_at_cursor(in_RSI);
        }
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        stb_textedit_find_charpos
                  (in_stack_ffffffffffffff70,
                   (ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
        if (local_68 == local_70) {
          return;
        }
        if (in_RSI->has_preferred_x != '\0') {
          local_7c = in_RSI->preferred_x;
        }
        in_RSI->cursor = local_68;
        fVar5 = local_7c;
        STB_TEXTEDIT_LAYOUTROW
                  ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffff64,local_7c),
                   (ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff54);
        iVar3 = 0;
        goto LAB_0018a2c2;
      }
      local_14 = local_14 & 0x20000 | 0x10000;
    }
    if (local_14 != 0x10003) {
      if (local_14 == 0x10004) {
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        stb_textedit_move_to_first((STB_TexteditState *)0x18a5d7);
        if (in_RSI->single_line == '\0') {
          while( true ) {
            bVar1 = false;
            if (0 < in_RSI->cursor) {
              IVar2 = STB_TEXTEDIT_GETCHAR
                                ((ImGuiInputTextState *)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                 in_stack_ffffffffffffff3c);
              bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
            }
            if (!bVar1) break;
            in_RSI->cursor = in_RSI->cursor + -1;
          }
        }
        else {
          in_RSI->cursor = 0;
        }
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10005) {
        iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        stb_textedit_move_to_first((STB_TexteditState *)0x18a698);
        if (in_RSI->single_line == '\0') {
          while( true ) {
            bVar1 = false;
            if (in_RSI->cursor < iVar3) {
              IVar2 = STB_TEXTEDIT_GETCHAR
                                ((ImGuiInputTextState *)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                 in_stack_ffffffffffffff3c);
              bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
            }
            if (!bVar1) break;
            in_RSI->cursor = in_RSI->cursor + 1;
          }
        }
        else {
          in_RSI->cursor = iVar3;
        }
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10006) {
        in_RSI->select_end = 0;
        in_RSI->select_start = 0;
        in_RSI->cursor = 0;
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10007) {
        iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
        in_RSI->cursor = iVar3;
        in_RSI->select_end = 0;
        in_RSI->select_start = 0;
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10008) {
LAB_0018a392:
        if (in_RSI->select_start == in_RSI->select_end) {
          iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
          if (in_RSI->cursor < iVar3) {
            stb_textedit_delete((ImGuiInputTextState *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (STB_TexteditState *)
                                CONCAT44(in_stack_ffffffffffffff3c,
                                         CONCAT13(in_stack_ffffffffffffff3b,
                                                  CONCAT12(in_stack_ffffffffffffff3a,
                                                           CONCAT11(in_stack_ffffffffffffff39,
                                                                    in_stack_ffffffffffffff38)))),0,
                                0x18a406);
          }
        }
        else {
          stb_textedit_delete_selection
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
        }
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x10009) {
LAB_0018a419:
        if (in_RSI->select_start == in_RSI->select_end) {
          stb_textedit_clamp((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (STB_TexteditState *)
                             CONCAT44(in_stack_ffffffffffffff3c,
                                      CONCAT13(in_stack_ffffffffffffff3b,
                                               CONCAT12(in_stack_ffffffffffffff3a,
                                                        CONCAT11(in_stack_ffffffffffffff39,
                                                                 in_stack_ffffffffffffff38)))));
          if (0 < in_RSI->cursor) {
            stb_textedit_delete((ImGuiInputTextState *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (STB_TexteditState *)
                                CONCAT44(in_stack_ffffffffffffff3c,
                                         CONCAT13(in_stack_ffffffffffffff3b,
                                                  CONCAT12(in_stack_ffffffffffffff3a,
                                                           CONCAT11(in_stack_ffffffffffffff39,
                                                                    in_stack_ffffffffffffff38)))),0,
                                0x18a491);
            in_RSI->cursor = in_RSI->cursor + -1;
          }
        }
        else {
          stb_textedit_delete_selection
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
        }
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x1000a) {
        stb_text_undo((ImGuiInputTextState *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (STB_TexteditState *)
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x1000b) {
        stb_text_redo((ImGuiInputTextState *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (STB_TexteditState *)
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x1000c) {
        if (in_RSI->select_start != in_RSI->select_end) {
          stb_textedit_move_to_first((STB_TexteditState *)0x189d4f);
          return;
        }
        iVar3 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL
                          ((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
        in_RSI->cursor = iVar3;
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        return;
      }
      if (local_14 == 0x1000d) {
        if (in_RSI->select_start != in_RSI->select_end) {
          stb_textedit_move_to_last
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
          return;
        }
        iVar3 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL
                          ((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
        in_RSI->cursor = iVar3;
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        return;
      }
      if (local_14 == 0x30000) {
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        stb_textedit_prep_selection_at_cursor(in_RSI);
        if (0 < in_RSI->select_end) {
          in_RSI->select_end = in_RSI->select_end + -1;
        }
        in_RSI->cursor = in_RSI->select_end;
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x30001) {
        stb_textedit_prep_selection_at_cursor(in_RSI);
        in_RSI->select_end = in_RSI->select_end + 1;
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff3c,
                                    CONCAT13(in_stack_ffffffffffffff3b,
                                             CONCAT12(in_stack_ffffffffffffff3a,
                                                      CONCAT11(in_stack_ffffffffffffff39,
                                                               in_stack_ffffffffffffff38)))));
        in_RSI->cursor = in_RSI->select_end;
        in_RSI->has_preferred_x = '\0';
        return;
      }
      if (local_14 == 0x30002) goto LAB_0018a17b;
      if (local_14 != 0x30003) {
        if (local_14 == 0x30004) {
          stb_textedit_clamp((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (STB_TexteditState *)
                             CONCAT44(in_stack_ffffffffffffff3c,
                                      CONCAT13(in_stack_ffffffffffffff3b,
                                               CONCAT12(in_stack_ffffffffffffff3a,
                                                        CONCAT11(in_stack_ffffffffffffff39,
                                                                 in_stack_ffffffffffffff38)))));
          stb_textedit_prep_selection_at_cursor(in_RSI);
          if (in_RSI->single_line == '\0') {
            while( true ) {
              bVar1 = false;
              if (0 < in_RSI->cursor) {
                IVar2 = STB_TEXTEDIT_GETCHAR
                                  ((ImGuiInputTextState *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff3c);
                bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
              }
              if (!bVar1) break;
              in_RSI->cursor = in_RSI->cursor + -1;
            }
          }
          else {
            in_RSI->cursor = 0;
          }
          in_RSI->select_end = in_RSI->cursor;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x30005) {
          iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
          stb_textedit_clamp((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (STB_TexteditState *)
                             CONCAT44(in_stack_ffffffffffffff3c,
                                      CONCAT13(in_stack_ffffffffffffff3b,
                                               CONCAT12(in_stack_ffffffffffffff3a,
                                                        CONCAT11(in_stack_ffffffffffffff39,
                                                                 in_stack_ffffffffffffff38)))));
          stb_textedit_prep_selection_at_cursor(in_RSI);
          if (in_RSI->single_line == '\0') {
            while( true ) {
              bVar1 = false;
              if (in_RSI->cursor < iVar3) {
                IVar2 = STB_TEXTEDIT_GETCHAR
                                  ((ImGuiInputTextState *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff3c);
                bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
              }
              if (!bVar1) break;
              in_RSI->cursor = in_RSI->cursor + 1;
            }
          }
          else {
            in_RSI->cursor = iVar3;
          }
          in_RSI->select_end = in_RSI->cursor;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x30006) {
          stb_textedit_prep_selection_at_cursor(in_RSI);
          in_RSI->select_end = 0;
          in_RSI->cursor = 0;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x30007) {
          stb_textedit_prep_selection_at_cursor(in_RSI);
          iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
          in_RSI->select_end = iVar3;
          in_RSI->cursor = iVar3;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x30008) goto LAB_0018a392;
        if (local_14 != 0x30009) {
          if (local_14 == 0x3000c) {
            if (in_RSI->select_start == in_RSI->select_end) {
              stb_textedit_prep_selection_at_cursor(in_RSI);
            }
            iVar3 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff3c);
            in_RSI->cursor = iVar3;
            in_RSI->select_end = in_RSI->cursor;
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))));
            return;
          }
          if (local_14 == 0x3000d) {
            if (in_RSI->select_start == in_RSI->select_end) {
              stb_textedit_prep_selection_at_cursor(in_RSI);
            }
            iVar3 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff3c);
            in_RSI->cursor = iVar3;
            in_RSI->select_end = in_RSI->cursor;
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff3c,
                                        CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          CONCAT11(in_stack_ffffffffffffff39,
                                                                   in_stack_ffffffffffffff38)))));
            return;
          }
          iVar3 = STB_TEXTEDIT_KEYTOTEXT(local_14);
          if (iVar3 < 1) {
            return;
          }
          if ((iVar3 == 10) && (in_RSI->single_line != '\0')) {
            return;
          }
          if ((in_RSI->insert_mode != '\0') && (in_RSI->select_start == in_RSI->select_end)) {
            in_stack_ffffffffffffff44 = in_RSI->cursor;
            iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
            if (in_stack_ffffffffffffff44 < iVar3) {
              stb_text_makeundo_replace
                        ((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (STB_TexteditState *)CONCAT44(in_stack_ffffffffffffff4c,local_14),
                         in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c);
              STB_TEXTEDIT_DELETECHARS
                        ((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c,local_14);
              bVar1 = STB_TEXTEDIT_INSERTCHARS
                                ((ImGuiInputTextState *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 in_stack_ffffffffffffff64,
                                 (ImWchar *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                 in_stack_ffffffffffffff54);
              if (!bVar1) {
                return;
              }
              in_RSI->cursor = in_RSI->cursor + 1;
              in_RSI->has_preferred_x = '\0';
              return;
            }
          }
          stb_textedit_delete_selection
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
          bVar1 = STB_TEXTEDIT_INSERTCHARS
                            ((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             in_stack_ffffffffffffff64,
                             (ImWchar *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             in_stack_ffffffffffffff54);
          if (!bVar1) {
            return;
          }
          stb_text_makeundo_insert
                    ((STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c,
                     CONCAT13(in_stack_ffffffffffffff3b,
                              CONCAT12(in_stack_ffffffffffffff3a,
                                       CONCAT11(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38)
                                      )));
          in_RSI->cursor = in_RSI->cursor + 1;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        goto LAB_0018a419;
      }
    }
    bVar1 = (local_14 & 0x20000) == 0;
    if (in_RSI->single_line == '\0') {
      if (bVar1) {
        if (in_RSI->select_start != in_RSI->select_end) {
          stb_textedit_move_to_last
                    ((ImGuiInputTextState *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (STB_TexteditState *)
                     CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,
                                                CONCAT11(in_stack_ffffffffffffff39,
                                                         in_stack_ffffffffffffff38)))));
        }
      }
      else {
        stb_textedit_prep_selection_at_cursor(in_RSI);
      }
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff3c,
                                  CONCAT13(in_stack_ffffffffffffff3b,
                                           CONCAT12(in_stack_ffffffffffffff3a,
                                                    CONCAT11(in_stack_ffffffffffffff39,
                                                             in_stack_ffffffffffffff38)))));
      stb_textedit_find_charpos
                (in_stack_ffffffffffffff70,
                 (ImGuiInputTextState *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      if (local_24 == 0) {
        return;
      }
      if (in_RSI->has_preferred_x != '\0') {
        local_34 = in_RSI->preferred_x;
      }
      in_RSI->cursor = local_28 + local_24;
      fVar5 = local_34;
      STB_TEXTEDIT_LAYOUTROW
                ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (ImGuiInputTextState *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff54);
      local_5c = local_4c;
      local_50 = 0;
      goto LAB_0018a0a8;
    }
    local_14 = local_14 & 0x20000 | 0x10001;
  } while( true );
LAB_0018a2c2:
  if (local_80 <= iVar3) {
LAB_0018a33b:
    stb_textedit_clamp((ImGuiInputTextState *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (STB_TexteditState *)
                       CONCAT44(local_7c,CONCAT13(in_stack_ffffffffffffff3b,
                                                  CONCAT12(in_stack_ffffffffffffff3a,
                                                           CONCAT11(in_stack_ffffffffffffff39,
                                                                    in_stack_ffffffffffffff38)))));
    in_RSI->has_preferred_x = '\x01';
    in_RSI->preferred_x = fVar5;
    if (in_stack_ffffffffffffff64 == 0) {
      return;
    }
    in_RSI->select_end = in_RSI->cursor;
    return;
  }
  fVar4 = STB_TEXTEDIT_GETWIDTH
                    ((ImGuiInputTextState *)CONCAT44(in_stack_ffffffffffffff4c,local_14),
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  if (((fVar4 == -1.0) && (!NAN(fVar4))) ||
     (in_stack_ffffffffffffff6c = fVar4 + in_stack_ffffffffffffff6c,
     fVar5 < in_stack_ffffffffffffff6c)) goto LAB_0018a33b;
  in_RSI->cursor = in_RSI->cursor + 1;
  iVar3 = iVar3 + 1;
  goto LAB_0018a2c2;
LAB_0018a0a8:
  if (local_38 <= local_50) {
LAB_0018a124:
    stb_textedit_clamp((ImGuiInputTextState *)CONCAT44(in_stack_ffffffffffffff44,fVar5),
                       (STB_TexteditState *)
                       CONCAT44(in_stack_ffffffffffffff3c,
                                CONCAT13(in_stack_ffffffffffffff3b,
                                         CONCAT12(in_stack_ffffffffffffff3a,
                                                  CONCAT11(in_stack_ffffffffffffff39,
                                                           in_stack_ffffffffffffff38)))));
    in_RSI->has_preferred_x = '\x01';
    in_RSI->preferred_x = local_34;
    if (bVar1) {
      return;
    }
    in_RSI->select_end = in_RSI->cursor;
    return;
  }
  fVar4 = STB_TEXTEDIT_GETWIDTH
                    ((ImGuiInputTextState *)CONCAT44(in_stack_ffffffffffffff4c,local_14),
                     in_stack_ffffffffffffff44,(int)fVar5);
  if (((fVar4 == -1.0) && (!NAN(fVar4))) || (local_5c = fVar4 + local_5c, local_34 < local_5c))
  goto LAB_0018a124;
  in_RSI->cursor = in_RSI->cursor + 1;
  local_50 = local_50 + 1;
  goto LAB_0018a0a8;
}

Assistant:

static void stb_textedit_key(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_KEYTYPE key)
{
retry:
   switch (key) {
      default: {
         int c = STB_TEXTEDIT_KEYTOTEXT(key);
         if (c > 0) {
            STB_TEXTEDIT_CHARTYPE ch = (STB_TEXTEDIT_CHARTYPE) c;

            // can't add newline in single-line mode
            if (c == '\n' && state->single_line)
               break;

            if (state->insert_mode && !STB_TEXT_HAS_SELECTION(state) && state->cursor < STB_TEXTEDIT_STRINGLEN(str)) {
               stb_text_makeundo_replace(str, state, state->cursor, 1, 1);
               STB_TEXTEDIT_DELETECHARS(str, state->cursor, 1);
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            } else {
               stb_textedit_delete_selection(str,state); // implicity clamps
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  stb_text_makeundo_insert(state, state->cursor, 1);
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            }
         }
         break;
      }

#ifdef STB_TEXTEDIT_K_INSERT
      case STB_TEXTEDIT_K_INSERT:
         state->insert_mode = !state->insert_mode;
         break;
#endif
         
      case STB_TEXTEDIT_K_UNDO:
         stb_text_undo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_REDO:
         stb_text_redo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT:
         // if currently there's a selection, move cursor to start of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else 
            if (state->cursor > 0)
               --state->cursor;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_RIGHT:
         // if currently there's a selection, move cursor to end of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);
         else
            ++state->cursor;
         stb_textedit_clamp(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         // move selection left
         if (state->select_end > 0)
            --state->select_end;
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_MOVEWORDLEFT
      case STB_TEXTEDIT_K_WORDLEFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDLEFT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

#ifdef STB_TEXTEDIT_MOVEWORDRIGHT
      case STB_TEXTEDIT_K_WORDRIGHT:
         if (STB_TEXT_HAS_SELECTION(state)) 
            stb_textedit_move_to_last(str, state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDRIGHT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

      case STB_TEXTEDIT_K_RIGHT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         // move selection right
         ++state->select_end;
         stb_textedit_clamp(str, state);
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_DOWN:
      case STB_TEXTEDIT_K_DOWN | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;

         if (state->single_line) {
            // on windows, up&down in single-line behave like left&right
            key = STB_TEXTEDIT_K_RIGHT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str,state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         // now find character position down a row
         if (find.length) {
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            float x;
            int start = find.first_char + find.length;
            state->cursor = start;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, start, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;
         }
         break;
      }
         
      case STB_TEXTEDIT_K_UP:
      case STB_TEXTEDIT_K_UP | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;

         if (state->single_line) {
            // on windows, up&down become left&right
            key = STB_TEXTEDIT_K_LEFT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         // can only go up if there's a previous row
         if (find.prev_first != find.first_char) {
            // now find character position up a row
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            float x;
            state->cursor = find.prev_first;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, find.prev_first, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;
         }
         break;
      }

      case STB_TEXTEDIT_K_DELETE:
      case STB_TEXTEDIT_K_DELETE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            int n = STB_TEXTEDIT_STRINGLEN(str);
            if (state->cursor < n)
               stb_textedit_delete(str, state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_BACKSPACE:
      case STB_TEXTEDIT_K_BACKSPACE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            stb_textedit_clamp(str, state);
            if (state->cursor > 0) {
               stb_textedit_delete(str, state, state->cursor-1, 1);
               --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;
         
#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2:
#endif
      case STB_TEXTEDIT_K_TEXTSTART:
         state->cursor = state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2:
#endif
      case STB_TEXTEDIT_K_TEXTEND:
         state->cursor = STB_TEXTEDIT_STRINGLEN(str);
         state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;
        
#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTSTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTEND | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = STB_TEXTEDIT_STRINGLEN(str);
         state->has_preferred_x = 0;
         break;


#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2:
#endif
      case STB_TEXTEDIT_K_LINESTART:
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2:
#endif
      case STB_TEXTEDIT_K_LINEEND: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
             ++state->cursor;
         state->has_preferred_x = 0;
         break;
      }

#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINESTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINEEND | STB_TEXTEDIT_K_SHIFT: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
            ++state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;
      }

// @TODO:
//    STB_TEXTEDIT_K_PGUP      - move cursor up a page
//    STB_TEXTEDIT_K_PGDOWN    - move cursor down a page
   }
}